

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

CURLcode Curl_h1_req_write_head(httpreq *req,int http_minor,dynbuf *dbuf)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  pcVar2 = req->scheme;
  bVar6 = pcVar2 == (char *)0x0;
  if (bVar6) {
    pcVar2 = "";
  }
  pcVar3 = "://";
  if (bVar6) {
    pcVar3 = "";
  }
  pcVar4 = req->authority;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  pcVar5 = req->path;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "";
  }
  CVar1 = Curl_dyn_addf(dbuf,"%s %s%s%s%s HTTP/1.%d\r\n",req,pcVar2,pcVar3,pcVar4,pcVar5,
                        (ulong)(uint)http_minor);
  if (CVar1 == CURLE_OK) {
    CVar1 = Curl_dynhds_h1_dprint(&req->headers,dbuf);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_dyn_addn(dbuf,"\r\n",2);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_h1_req_write_head(struct httpreq *req, int http_minor,
                                struct dynbuf *dbuf)
{
  CURLcode result;

  result = Curl_dyn_addf(dbuf, "%s %s%s%s%s HTTP/1.%d\r\n",
                         req->method,
                         req->scheme? req->scheme : "",
                         req->scheme? "://" : "",
                         req->authority? req->authority : "",
                         req->path? req->path : "",
                         http_minor);
  if(result)
    goto out;

  result = Curl_dynhds_h1_dprint(&req->headers, dbuf);
  if(result)
    goto out;

  result = Curl_dyn_addn(dbuf, STRCONST("\r\n"));

out:
  return result;
}